

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrPrimitiveAssembler.hpp
# Opt level: O2

void rr::pa::LineStrip::
     exec<__gnu_cxx::__normal_iterator<rr::pa::Line*,std::vector<rr::pa::Line,std::allocator<rr::pa::Line>>>>
               (__normal_iterator<rr::pa::Line_*,_std::vector<rr::pa::Line,_std::allocator<rr::pa::Line>_>_>
                outputIterator,VertexPacket **vertices,size_t numVertices,
               ProvokingVertex provokingConvention)

{
  VertexPacket *pVVar1;
  long lVar2;
  
  if (numVertices != 0) {
    for (lVar2 = 0; numVertices - 1 != lVar2; lVar2 = lVar2 + 1) {
      pVVar1 = (vertices + lVar2)[1];
      (outputIterator._M_current)->v0 = vertices[lVar2];
      (outputIterator._M_current)->v1 = pVVar1;
      (outputIterator._M_current)->provokingIndex =
           (uint)(provokingConvention != PROVOKINGVERTEX_FIRST);
      outputIterator._M_current = outputIterator._M_current + 1;
    }
  }
  return;
}

Assistant:

static void exec (Iterator outputIterator, VertexPacket* const* vertices, size_t numVertices, rr::ProvokingVertex provokingConvention)
	{
		if (numVertices == 0)
		{
		}
		else
		{
			VertexPacket* prev = vertices[0];

			for (size_t ndx = 1; ndx < numVertices; ++ndx)
			{
				*(outputIterator++) = Line(prev, vertices[ndx], (provokingConvention == rr::PROVOKINGVERTEX_FIRST) ? (0) : (1));
				prev = vertices[ndx];
			}
		}
	}